

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<float_const&>::captureExpression<(Catch::Internal::Operator)0,double>
          (ExpressionLhs<float_const&> *this,double *rhs)

{
  undefined4 uVar1;
  string *__return_storage_ptr__;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string local_38;
  
  uVar1 = 0x11;
  if ((double)**(float **)(this + 0x228) == *rhs) {
    uVar1 = 0;
  }
  *(undefined4 *)(this + 0x40) = uVar1;
  __return_storage_ptr__ = &local_38;
  Detail::StringMakerBase<true>::convert<float>(__return_storage_ptr__,*(float **)(this + 0x228));
  std::__cxx11::string::_M_assign((string *)(this + 0x50));
  toString_abi_cxx11_(&local_58,(Catch *)__return_storage_ptr__,*rhs);
  std::__cxx11::string::_M_assign((string *)(this + 0x70));
  std::__cxx11::string::string(local_78,"==",&local_79);
  std::__cxx11::string::_M_assign((string *)(this + 0x90));
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (ExpressionResultBuilder *)this;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }